

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.cpp
# Opt level: O2

VMatrix * __thiscall
rlottie::internal::model::Repeater::Transform::matrix
          (VMatrix *__return_storage_ptr__,Transform *this,int frameNo,float multiplier)

{
  VPointF VVar1;
  VPointF VVar2;
  VMatrix *pVVar3;
  float fVar4;
  float fVar5;
  
  VVar1 = Property<VPointF,_void>::value(&this->mScale,frameNo);
  fVar4 = powf(VVar1.mx / 100.0,multiplier);
  fVar5 = powf(VVar1.my / 100.0,multiplier);
  VMatrix::VMatrix(__return_storage_ptr__);
  VVar2 = Property<VPointF,_void>::value(&this->mPosition,frameNo);
  VVar1.my = VVar2.my * multiplier;
  VVar1.mx = VVar2.mx * multiplier;
  pVVar3 = VMatrix::translate(__return_storage_ptr__,VVar1);
  VVar1 = Property<VPointF,_void>::value(&this->mAnchor,frameNo);
  pVVar3 = VMatrix::translate(pVVar3,VVar1);
  VVar2.my = fVar5;
  VVar2.mx = fVar4;
  pVVar3 = VMatrix::scale(pVVar3,VVar2);
  fVar4 = Property<float,_void>::value(&this->mRotation,frameNo);
  pVVar3 = VMatrix::rotate(pVVar3,fVar4 * multiplier,Z);
  VVar1 = Property<VPointF,_void>::value(&this->mAnchor,frameNo);
  VMatrix::translate(pVVar3,(VPointF)((ulong)VVar1 ^ 0x8000000080000000));
  return __return_storage_ptr__;
}

Assistant:

VMatrix model::Repeater::Transform::matrix(int frameNo, float multiplier) const
{
    VPointF scale = mScale.value(frameNo) / 100.f;
    scale.setX(std::pow(scale.x(), multiplier));
    scale.setY(std::pow(scale.y(), multiplier));
    VMatrix m;
    m.translate(mPosition.value(frameNo) * multiplier)
        .translate(mAnchor.value(frameNo))
        .scale(scale)
        .rotate(mRotation.value(frameNo) * multiplier)
        .translate(-mAnchor.value(frameNo));

    return m;
}